

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_fragment_shading_rate_enums_features
          (Impl *this,Value *state,VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV **out_features
          )

{
  VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *pVVar1;
  Type pGVar2;
  
  pVVar1 = (VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar1 != (VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *)0x0) {
    pVVar1->fragmentShadingRateEnums = 0;
    pVVar1->supersampleFragmentShadingRates = 0;
    *(undefined8 *)&pVVar1->noInvocationFragmentShadingRates = 0;
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
  }
  *out_features = pVVar1;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"fragmentShadingRateEnums");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->fragmentShadingRateEnums = (pGVar2->data_).s.length;
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"noInvocationFragmentShadingRates");
    if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar1->noInvocationFragmentShadingRates = (pGVar2->data_).s.length;
      pGVar2 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"supersampleFragmentShadingRates");
      if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar1->supersampleFragmentShadingRates = (pGVar2->data_).s.length;
        return true;
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_fragment_shading_rate_enums_features(
		const Value &state,
		VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV **out_features)
{
	auto *features = allocator.allocate_cleared<VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV>();
	*out_features = features;

	features->fragmentShadingRateEnums = state["fragmentShadingRateEnums"].GetUint();
	features->noInvocationFragmentShadingRates = state["noInvocationFragmentShadingRates"].GetUint();
	features->supersampleFragmentShadingRates = state["supersampleFragmentShadingRates"].GetUint();
	return true;
}